

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O3

type __thiscall
itlib::
flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
::operator[]<Rml::RenderInterface*&>
          (flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
           *this,RenderInterface **k)

{
  iterator __position;
  __uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> local_20;
  
  __position = lower_bound<Rml::RenderInterface*>(this,k);
  if ((__position._M_current ==
       *(pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>
         **)(this + 8)) || (*k < (__position._M_current)->first)) {
    local_20._M_t.
    super__Tuple_impl<0UL,_Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>.
    super__Head_base<0UL,_Rml::RenderManager_*,_false>._M_head_impl =
         (tuple<Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>)
         (_Tuple_impl<0UL,_Rml::RenderManager_*,_std::default_delete<Rml::RenderManager>_>)0x0;
    __position._M_current =
         (pair<Rml::RenderInterface_*,_std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>_>
          *)std::
            vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>
            ::
            _M_emplace_aux<Rml::RenderInterface*&,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>
                      ((vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>
                        *)this,__position._M_current,k,
                       (unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
                       &local_20);
    std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::~unique_ptr
              ((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)&local_20
              );
  }
  return &(__position._M_current)->second;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }